

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O0

void ripemd160_done(ripemd160_ctx *ctx,ripemd160 *res)

{
  leint32_t lVar1;
  ulong local_28;
  size_t i;
  uint64_t sizedesc;
  ripemd160 *res_local;
  ripemd160_ctx *ctx_local;
  
  sizedesc = (uint64_t)res;
  res_local = (ripemd160 *)ctx;
  i = cpu_to_le64(ctx->bytes << 3);
  add((ripemd160_ctx *)res_local,ripemd160_done::pad,
      (0x77 - (*(ulong *)((long)&res_local[1].u + 4) & 0x3f) & 0x3f) + 1);
  add((ripemd160_ctx *)res_local,&i,8);
  for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
    lVar1 = cpu_to_le32((res_local->u).u32[local_28]);
    *(leint32_t *)(sizedesc + local_28 * 4) = lVar1;
  }
  invalidate_ripemd160((ripemd160_ctx *)res_local);
  return;
}

Assistant:

void ripemd160_done(struct ripemd160_ctx *ctx, struct ripemd160 *res)
{
	static const unsigned char pad[64] = {0x80};
	uint64_t sizedesc;
	size_t i;

	sizedesc = cpu_to_le64(ctx->bytes << 3);
	/* Add '1' bit to terminate, then all 0 bits, up to next block - 8. */
	add(ctx, pad, 1 + ((119 - (ctx->bytes % 64)) % 64));
	/* Add number of bits of data (big endian) */
	add(ctx, &sizedesc, 8);
	for (i = 0; i < sizeof(ctx->s) / sizeof(ctx->s[0]); i++)
		res->u.u32[i] = cpu_to_le32(ctx->s[i]);
	invalidate_ripemd160(ctx);
}